

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

char * __thiscall FileReader::GetsFromBuffer(FileReader *this,char *bufptr,char *strbuf,int len)

{
  char *pcVar1;
  char *local_38;
  char *p;
  int len_local;
  char *strbuf_local;
  char *bufptr_local;
  FileReader *this_local;
  
  p._4_4_ = len;
  if (this->Length - this->FilePos < (long)len) {
    p._4_4_ = (int)this->Length - (int)this->FilePos;
  }
  local_38 = strbuf;
  if (p._4_4_ < 1) {
    this_local = (FileReader *)0x0;
  }
  else {
    while (1 < p._4_4_) {
      if (bufptr[this->FilePos] == '\0') {
        this->FilePos = this->FilePos + 1;
        break;
      }
      if (bufptr[this->FilePos] != '\r') {
        pcVar1 = local_38 + 1;
        *local_38 = bufptr[this->FilePos];
        p._4_4_ = p._4_4_ + -1;
        local_38 = pcVar1;
        if (bufptr[this->FilePos] == '\n') {
          this->FilePos = this->FilePos + 1;
          break;
        }
      }
      this->FilePos = this->FilePos + 1;
    }
    if (local_38 == strbuf) {
      this_local = (FileReader *)0x0;
    }
    else {
      *local_38 = '\0';
      this_local = (FileReader *)strbuf;
    }
  }
  return (char *)this_local;
}

Assistant:

char *FileReader::GetsFromBuffer(const char * bufptr, char *strbuf, int len)
{
	if (len>Length-FilePos) len=Length-FilePos;
	if (len <= 0) return NULL;

	char *p = strbuf;
	while (len > 1)
	{
		if (bufptr[FilePos] == 0)
		{
			FilePos++;
			break;
		}
		if (bufptr[FilePos] != '\r')
		{
			*p++ = bufptr[FilePos];
			len--;
			if (bufptr[FilePos] == '\n') 
			{
				FilePos++;
				break;
			}
		}
		FilePos++;
	}
	if (p==strbuf) return NULL;
	*p++=0;
	return strbuf;
}